

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O1

BLOCK_SIZE get_partition_subsize(BLOCK_SIZE bsize,PARTITION_TYPE partition)

{
  bool bVar1;
  BLOCK_SIZE BVar2;
  long lVar3;
  undefined7 in_register_00000039;
  
  switch((int)CONCAT71(in_register_00000039,bsize)) {
  case 6:
    lVar3 = 2;
    break;
  default:
    lVar3 = 6;
    bVar1 = true;
    goto LAB_00ae70f8;
  case 9:
    lVar3 = 3;
    break;
  case 0xc:
    lVar3 = 4;
    break;
  case 0xf:
    lVar3 = 5;
  }
  bVar1 = false;
LAB_00ae70f8:
  BVar2 = BLOCK_INVALID;
  if (!bVar1) {
    BVar2 = subsize_lookup[partition][lVar3];
  }
  return BVar2;
}

Assistant:

static inline BLOCK_SIZE get_partition_subsize(BLOCK_SIZE bsize,
                                               PARTITION_TYPE partition) {
  if (partition == PARTITION_INVALID) {
    return BLOCK_INVALID;
  } else {
    const int sqr_bsize_idx = get_sqr_bsize_idx(bsize);
    return sqr_bsize_idx >= SQR_BLOCK_SIZES
               ? BLOCK_INVALID
               : subsize_lookup[partition][sqr_bsize_idx];
  }
}